

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  TrackerContext *pTVar1;
  bool bVar2;
  element_type *peVar3;
  pointer in_RSI;
  TrackerContext *in_RDI;
  ITrackerPtr childTracker;
  ITracker *currentTracker;
  shared_ptr<Catch::TestCaseTracking::SectionTracker> section;
  shared_ptr<Catch::TestCaseTracking::SectionTracker> *in_stack_ffffffffffffff58;
  SectionTracker *in_stack_ffffffffffffff60;
  shared_ptr<Catch::TestCaseTracking::ITracker> *in_stack_ffffffffffffff68;
  undefined1 local_80 [8];
  ITracker **in_stack_ffffffffffffff88;
  ITracker in_stack_ffffffffffffff98;
  TrackerContext *local_28;
  pointer local_10;
  TrackerContext *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::shared_ptr
            ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)0x126ae4);
  local_28 = (TrackerContext *)TrackerContext::currentTracker(local_8);
  (*(code *)(local_28->m_rootTracker).
            super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            [0xc]._vptr_ITracker)(&stack0xffffffffffffffc8,local_28,local_10);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc8);
  if (bVar2) {
    std::
    static_pointer_cast<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::ITracker>
              (in_stack_ffffffffffffff68);
    clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::operator=
              ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)0x126b54);
  }
  else {
    std::
    make_shared<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              ((NameAndLocation *)in_stack_ffffffffffffff98._vptr_ITracker,local_28,
               in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff60 = (SectionTracker *)&stack0xffffffffffffff98;
    clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::operator=
              ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)0x126bc0);
    pTVar1 = local_28;
    std::shared_ptr<Catch::TestCaseTracking::ITracker>::
    shared_ptr<Catch::TestCaseTracking::SectionTracker,void>
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    (*(code *)(pTVar1->m_rootTracker).
              super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr[0xb]._vptr_ITracker)(pTVar1,local_80);
    clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)0x126c00);
  }
  clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
            ((shared_ptr<Catch::TestCaseTracking::ITracker> *)0x126c36);
  bVar2 = TrackerContext::completedCycle(local_8);
  if (!bVar2) {
    clara::std::
    __shared_ptr_access<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x126c54);
    tryOpen(in_stack_ffffffffffffff60);
  }
  peVar3 = clara::std::
           __shared_ptr_access<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffff60);
  clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::~shared_ptr
            ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)0x126c8a);
  return peVar3;
}

Assistant:

SectionTracker& SectionTracker::acquire( TrackerContext& ctx, NameAndLocation const& nameAndLocation ) {
        std::shared_ptr<SectionTracker> section;

        ITracker& currentTracker = ctx.currentTracker();
        if( ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
            assert( childTracker );
            assert( childTracker->isSectionTracker() );
            section = std::static_pointer_cast<SectionTracker>( childTracker );
        }
        else {
            section = std::make_shared<SectionTracker>( nameAndLocation, ctx, &currentTracker );
            currentTracker.addChild( section );
        }
        if( !ctx.completedCycle() )
            section->tryOpen();
        return *section;
    }